

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddWarning
          (ErrorPrinter *this,string *filename,int line,int column,string *message)

{
  allocator local_49;
  string local_48;
  string *local_28;
  string *message_local;
  int column_local;
  int line_local;
  string *filename_local;
  ErrorPrinter *this_local;
  
  local_28 = message;
  message_local._0_4_ = column;
  message_local._4_4_ = line;
  _column_local = filename;
  filename_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"warning",&local_49);
  AddErrorOrWarning(this,filename,line,column,message,&local_48,(ostream *)&std::clog);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void AddWarning(const string& filename, int line, int column,
                  const string& message) {
    AddErrorOrWarning(filename, line, column, message, "warning", std::clog);
  }